

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

TCount NJamSpell::GetGramHashCount<std::pair<unsigned_int,unsigned_int>>
                 (pair<unsigned_int,_unsigned_int> key,TPerfectHash *ph,
                 vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                 *buckets)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  const_reference pvVar7;
  uint32_t local_44;
  TCount res;
  pair<unsigned_short,_unsigned_short> *data;
  uint32_t bucket;
  int TMP_BUF_SIZE;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *buckets_local;
  TPerfectHash *ph_local;
  pair<unsigned_int,_unsigned_int> key_local;
  
  ph_local = (TPerfectHash *)key;
  if (GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
      ::tmpBuffStream == '\0') {
    iVar3 = __cxa_guard_acquire(&GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                                 ::tmpBuffStream);
    if (iVar3 != 0) {
      MemStream::MemStream
                (&GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuffStream,
                 GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuff,0x7f);
      __cxa_atexit(MemStream::~MemStream,
                   &GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuffStream,
                   &__dso_handle);
      __cxa_guard_release(&GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                           ::tmpBuffStream);
    }
  }
  if (GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
      ::out == '\0') {
    iVar3 = __cxa_guard_acquire(&GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                                 ::out);
    if (iVar3 != 0) {
      std::ostream::ostream
                (GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                 ::out,(streambuf *)
                       &GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuffStream);
      __cxa_atexit(std::ostream::~ostream,
                   GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                   ::out,&__dso_handle);
      __cxa_guard_release(&GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                           ::out);
    }
  }
  MemStream::Reset(&GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuffStream);
  NHandyPack::Dump<std::pair<unsigned_int,unsigned_int>>
            ((ostream *)
             GetGramHashCount<std::pair<unsigned_int,unsigned_int>>(std::pair<unsigned_int,unsigned_int>,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
             ::out,(pair<unsigned_int,_unsigned_int> *)&ph_local);
  sVar6 = MemStream::Size(&GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuffStream);
  uVar4 = TPerfectHash::Hash(ph,GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuff,
                             sVar6);
  uVar5 = TPerfectHash::BucketsNumber(ph);
  if (uVar4 < uVar5) {
    pvVar7 = std::
             vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
             ::operator[](buckets,(ulong)uVar4);
    local_44 = 0;
    uVar1 = pvVar7->first;
    sVar6 = MemStream::Size(&GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuffStream
                           );
    uVar2 = CityHash16(GetGramHashCount<std::pair<unsigned_int,_unsigned_int>_>::tmpBuff,sVar6);
    if (uVar1 == uVar2) {
      local_44 = UnpackInt32(pvVar7->second);
    }
    return local_44;
  }
  __assert_fail("bucket < ph.BucketsNumber()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/jamspell/lang_model.cpp"
                ,0x18b,
                "TCount NJamSpell::GetGramHashCount(T, const TPerfectHash &, const std::vector<std::pair<uint16_t, uint16_t>> &) [T = std::pair<unsigned int, unsigned int>]"
               );
}

Assistant:

TCount GetGramHashCount(T key,
                        const TPerfectHash& ph,
                        const std::vector<std::pair<uint16_t, uint16_t>>& buckets)
{
    constexpr int TMP_BUF_SIZE = 128;
    static char tmpBuff[TMP_BUF_SIZE];
    static MemStream tmpBuffStream(tmpBuff, TMP_BUF_SIZE - 1);
    static std::ostream out(&tmpBuffStream);

    tmpBuffStream.Reset();

    NHandyPack::Dump(out, key);

    uint32_t bucket = ph.Hash(tmpBuff, tmpBuffStream.Size());

    assert(bucket < ph.BucketsNumber());
    const std::pair<uint16_t, uint16_t>& data = buckets[bucket];

    TCount res = TCount();
    if (data.first == CityHash16(tmpBuff, tmpBuffStream.Size())) {
        res = UnpackInt32(data.second);
    }
    return res;
}